

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall
wallet::coinselector_tests::effective_value_test::test_method(effective_value_test *this)

{
  optional<CFeeRate> feerate_00;
  optional<CFeeRate> feerate_01;
  optional<CFeeRate> feerate_02;
  undefined1 uVar1;
  bool bVar2;
  reference pvVar3;
  _Storage<CFeeRate,_true> _Var4;
  COutput *this_00;
  CTxOut *txout;
  CAmount CVar5;
  CAmount in_RDI;
  long in_FS_OFFSET;
  CAmount fees;
  int nInput;
  int input_bytes;
  CAmount expected_ev3;
  CAmount expected_ev1;
  CMutableTransaction tx;
  CAmount nValue;
  CFeeRate feerate;
  COutput output5;
  COutput output4;
  COutput output3;
  COutput output2;
  COutput output1;
  CMutableTransaction *in_stack_fffffffffffff7f8;
  char *pcVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  Txid *in_stack_fffffffffffff800;
  lazy_ostream *plVar9;
  COutPoint *in_stack_fffffffffffff808;
  char *pcVar10;
  COutput *pCVar11;
  undefined4 in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff814;
  CMutableTransaction *in_stack_fffffffffffff818;
  CMutableTransaction *this_01;
  const_string *msg;
  size_t in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff837;
  unit_test_log_t *in_stack_fffffffffffff838;
  undefined8 in_stack_fffffffffffff850;
  undefined4 uVar12;
  int in_stack_fffffffffffff858;
  int in_stack_fffffffffffff85c;
  CTxOut *in_stack_fffffffffffff860;
  COutPoint *in_stack_fffffffffffff868;
  COutput *in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff884;
  undefined1 in_stack_fffffffffffff885;
  undefined1 in_stack_fffffffffffff886;
  COutPoint *pCVar13;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  _Storage<CFeeRate,_true> in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  int64_t in_stack_fffffffffffff910;
  unit_test_log_t *local_6d8;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [64];
  CAmount local_680;
  undefined1 local_678 [16];
  undefined1 local_668 [64];
  CAmount local_628;
  undefined1 local_620 [16];
  undefined1 local_610 [64];
  lazy_ostream local_5d0;
  CAmount local_5c0;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [64];
  CAmount local_568;
  undefined1 local_560 [16];
  undefined1 local_550 [64];
  lazy_ostream local_510 [4];
  lazy_ostream local_4d0;
  CMutableTransaction *local_4c0;
  const_string *pcStack_4b8;
  CMutableTransaction *local_4b0;
  const_string *pcStack_4a8;
  CMutableTransaction *local_4a0;
  const_string *pcStack_498;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffff7f8,0);
  local_4d0._vptr_lazy_ostream = (_func_int **)0x2710;
  CMutableTransaction::CMutableTransaction(in_stack_fffffffffffff7f8);
  uVar7 = (uint32_t)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff818,
             CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff808,
                      (size_type)in_stack_fffffffffffff800);
  pvVar3->nValue = 10000;
  CMutableTransaction::GetHash(in_stack_fffffffffffff818);
  COutPoint::COutPoint(in_stack_fffffffffffff808,in_stack_fffffffffffff800,uVar7);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::at
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff808,
             (size_type)in_stack_fffffffffffff800);
  std::optional<CFeeRate>::optional<const_CFeeRate_&,_true>
            ((optional<CFeeRate> *)in_stack_fffffffffffff808,(CFeeRate *)in_stack_fffffffffffff800);
  pcVar10 = (char *)0x0;
  plVar9 = (lazy_ostream *)CONCAT44((int)((ulong)in_stack_fffffffffffff800 >> 0x20),1);
  pcVar6 = (char *)CONCAT44(uVar7,1);
  feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = in_stack_fffffffffffff8e8;
  feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = in_stack_fffffffffffff8e0;
  COutput::COutput(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                   in_stack_fffffffffffff85c,in_stack_fffffffffffff858,
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x30,0),
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x28,0),
                   CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x20,0),feerate_00);
  local_510[0]._vptr_lazy_ostream = (_func_int **)0x267c;
  do {
    pCVar13 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar10,(pointer)plVar9,(unsigned_long)pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff838,
               (const_string *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828,pcStack_498);
    _Var4 = (_Storage<CFeeRate,_true>)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar9,(char (*) [1])pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar10,(pointer)plVar9,(unsigned_long)pcVar6);
    local_568 = COutput::GetEffectiveValue((COutput *)pcVar10);
    pcVar10 = "expected_ev1";
    plVar9 = local_510;
    pcVar6 = "output1.GetEffectiveValue()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_550,local_560,0x434,1,2,&local_568);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar6);
    uVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar1);
  CMutableTransaction::GetHash(local_4a0);
  uVar7 = (uint32_t)((ulong)pcVar6 >> 0x20);
  COutPoint::COutPoint((COutPoint *)pcVar10,(Txid *)plVar9,uVar7);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::at
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)pcVar10,(size_type)plVar9);
  std::optional<CFeeRate>::optional<const_CFeeRate_&,_true>
            ((optional<CFeeRate> *)pcVar10,(CFeeRate *)plVar9);
  pCVar11 = (COutput *)0x0;
  plVar9 = (lazy_ostream *)CONCAT44((int)((ulong)plVar9 >> 0x20),1);
  pcVar6 = (char *)CONCAT44(uVar7,1);
  feerate_01.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = pCVar13;
  feerate_01.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = _Var4;
  COutput::COutput(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                   in_stack_fffffffffffff85c,in_stack_fffffffffffff858,
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x30,0),
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x28,0),
                   CONCAT17(uVar1,in_stack_fffffffffffff8d0),
                   SUB81((ulong)in_stack_fffffffffffff850 >> 0x20,0),feerate_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pCVar11,(pointer)plVar9,(unsigned_long)pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff838,
               (const_string *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828,pcStack_4a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar9,(char (*) [1])pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pCVar11,(pointer)plVar9,(unsigned_long)pcVar6);
    local_5c0 = COutput::GetEffectiveValue(pCVar11);
    pCVar11 = (COutput *)0x1ce4b4a;
    plVar9 = &local_4d0;
    pcVar6 = "output2.GetEffectiveValue()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_5a8,local_5b8,0x438,1,2,&local_5c0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    uVar12 = (undefined4)((ulong)in_stack_fffffffffffff850 >> 0x20);
  } while (bVar2);
  CMutableTransaction::GetHash(local_4b0);
  COutPoint::COutPoint((COutPoint *)pCVar11,(Txid *)plVar9,(uint32_t)((ulong)pcVar6 >> 0x20));
  this_00 = (COutput *)
            std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)pCVar11,(size_type)plVar9);
  CFeeRate::CFeeRate<int>((CFeeRate *)pcVar6,0);
  uVar8 = (undefined4)((ulong)pcVar6 >> 0x20);
  std::optional<CFeeRate>::optional<CFeeRate,_true>
            ((optional<CFeeRate> *)pCVar11,(CFeeRate *)plVar9);
  pcVar10 = (char *)0x0;
  plVar9 = (lazy_ostream *)CONCAT44((int)((ulong)plVar9 >> 0x20),1);
  pcVar6 = (char *)CONCAT44(uVar8,1);
  feerate_02.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = pCVar13;
  feerate_02.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = _Var4;
  COutput::COutput(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                   in_stack_fffffffffffff85c,in_stack_fffffffffffff858,SUB41((uint)uVar12 >> 0x18,0)
                   ,SUB41((uint)uVar12 >> 0x10,0),SUB41((uint)uVar12 >> 8,0),
                   CONCAT17(uVar1,in_stack_fffffffffffff8d0),SUB41(uVar12,0),feerate_02);
  local_5d0._vptr_lazy_ostream = (_func_int **)0xffffffffffffed40;
  msg = pcStack_4b8;
  do {
    pCVar13 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar10,(pointer)plVar9,(unsigned_long)pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff838,
               (const_string *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828,msg);
    txout = (CTxOut *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar9,(char (*) [1])pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar10,(pointer)plVar9,(unsigned_long)pcVar6);
    CVar5 = COutput::GetEffectiveValue((COutput *)pcVar10);
    pcVar10 = "expected_ev3";
    plVar9 = &local_5d0;
    pcVar6 = "output3.GetEffectiveValue()";
    local_628 = CVar5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_610,local_620,0x43d,1,2,&local_628);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar6);
    uVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar1);
  CMutableTransaction::GetHash(local_4c0);
  uVar7 = (uint32_t)((ulong)pcVar6 >> 0x20);
  COutPoint::COutPoint((COutPoint *)pcVar10,(Txid *)plVar9,uVar7);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::at
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)pcVar10,(size_type)plVar9);
  this_01 = (CMutableTransaction *)0x94;
  pcVar10 = (char *)0x0;
  plVar9 = (lazy_ostream *)CONCAT44((int)((ulong)plVar9 >> 0x20),1);
  pcVar6 = (char *)CONCAT44(uVar7,1);
  COutput::COutput(this_00,pCVar13,txout,(int)((ulong)CVar5 >> 0x20),(int)CVar5,(bool)uVar1,
                   (bool)in_stack_fffffffffffff886,(bool)in_stack_fffffffffffff885,
                   in_stack_fffffffffffff910,(bool)in_stack_fffffffffffff884,in_RDI);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar10,(pointer)plVar9,(unsigned_long)pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff838,
               (const_string *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar9,(char (*) [1])pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pcVar10,(pointer)plVar9,(unsigned_long)pcVar6);
    local_680 = COutput::GetEffectiveValue((COutput *)pcVar10);
    pcVar10 = "expected_ev1";
    plVar9 = local_510;
    pcVar6 = "output4.GetEffectiveValue()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_668,local_678,0x442,1,2,&local_680);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CMutableTransaction::GetHash(this_01);
  uVar7 = (uint32_t)((ulong)pcVar6 >> 0x20);
  COutPoint::COutPoint((COutPoint *)pcVar10,(Txid *)plVar9,uVar7);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::at
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)pcVar10,(size_type)plVar9);
  pCVar11 = (COutput *)0x0;
  plVar9 = (lazy_ostream *)CONCAT44((int)((ulong)plVar9 >> 0x20),1);
  pcVar6 = (char *)CONCAT44(uVar7,1);
  COutput::COutput(this_00,pCVar13,txout,(int)((ulong)CVar5 >> 0x20),(int)CVar5,(bool)uVar1,
                   (bool)in_stack_fffffffffffff886,(bool)in_stack_fffffffffffff885,
                   in_stack_fffffffffffff910,(bool)in_stack_fffffffffffff884,in_RDI);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pCVar11,(pointer)plVar9,(unsigned_long)pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff838,
               (const_string *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830),
               in_stack_fffffffffffff828,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar9,(char (*) [1])pcVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pCVar11,(pointer)plVar9,(unsigned_long)pcVar6);
    in_stack_fffffffffffff838 = (unit_test_log_t *)COutput::GetEffectiveValue(pCVar11);
    pCVar11 = (COutput *)0x1ce4b4a;
    plVar9 = &local_4d0;
    pcVar6 = "output5.GetEffectiveValue()";
    local_6d8 = in_stack_fffffffffffff838;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_6c0,local_6d0,0x446,1,2,&local_6d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar6);
    in_stack_fffffffffffff837 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff837);
  COutput::~COutput((COutput *)pcVar6);
  COutput::~COutput((COutput *)pcVar6);
  COutput::~COutput((COutput *)pcVar6);
  COutput::~COutput((COutput *)pcVar6);
  COutput::~COutput((COutput *)pcVar6);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(effective_value_test)
{
    const int input_bytes = 148;
    const CFeeRate feerate(1000);
    const CAmount nValue = 10000;
    const int nInput = 0;

    CMutableTransaction tx;
    tx.vout.resize(1);
    tx.vout[nInput].nValue = nValue;

    // standard case, pass feerate in constructor
    COutput output1(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    const CAmount expected_ev1 = 9852; // 10000 - 148
    BOOST_CHECK_EQUAL(output1.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass feerate in constructor
    COutput output2(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    BOOST_CHECK_EQUAL(output2.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1

    // negative effective value, pass feerate in constructor
    COutput output3(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, CFeeRate(100000));
    const CAmount expected_ev3 = -4800; // 10000 - 14800
    BOOST_CHECK_EQUAL(output3.GetEffectiveValue(), expected_ev3);

    // standard case, pass fees in constructor
    const CAmount fees = 148;
    COutput output4(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, fees);
    BOOST_CHECK_EQUAL(output4.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass fees in constructor
    COutput output5(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, /*fees=*/ 0);
    BOOST_CHECK_EQUAL(output5.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1
}